

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O1

void __thiscall Assimp::ScaleProcess::applyScaling(ScaleProcess *this,aiNode *currentNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  aiVector3D scale;
  aiVector3D pos;
  aiQuaternion rotation;
  aiVector3t<float> local_50;
  aiVector3t<float> local_44;
  aiQuaterniont<float> local_38;
  
  if (currentNode != (aiNode *)0x0) {
    local_44.x = 0.0;
    local_44.y = 0.0;
    local_44.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    local_38.w = 1.0;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_38.z = 0.0;
    aiMatrix4x4t<float>::Decompose(&currentNode->mTransformation,&local_50,&local_38,&local_44);
    fVar5 = this->mScale;
    fVar11 = local_38.y * local_38.y + local_38.z * local_38.z;
    fVar8 = 1.0 - (fVar11 + fVar11);
    fVar33 = local_38.x * local_38.y - local_38.z * local_38.w;
    fVar33 = fVar33 + fVar33;
    fVar12 = local_38.x * local_38.z + local_38.y * local_38.w;
    fVar12 = fVar12 + fVar12;
    fVar13 = local_38.z * local_38.w + local_38.x * local_38.y;
    fVar13 = fVar13 + fVar13;
    fVar11 = local_38.z * local_38.z + local_38.x * local_38.x;
    fVar29 = 1.0 - (fVar11 + fVar11);
    fVar27 = local_38.y * local_38.z - local_38.x * local_38.w;
    fVar27 = fVar27 + fVar27;
    fVar19 = local_38.x * local_38.z - local_38.y * local_38.w;
    fVar19 = fVar19 + fVar19;
    fVar16 = local_38.x * local_38.w + local_38.y * local_38.z;
    fVar16 = fVar16 + fVar16;
    fVar11 = local_38.x * local_38.x + local_38.y * local_38.y;
    fVar11 = 1.0 - (fVar11 + fVar11);
    fVar1 = fVar13 * 0.0;
    fVar2 = fVar19 * 0.0;
    fVar3 = local_44.x * fVar5 * 0.0;
    fVar24 = fVar8 + fVar1 + fVar2 + fVar3;
    fVar23 = fVar29 * 0.0;
    fVar9 = fVar16 * 0.0;
    fVar7 = fVar23 + fVar33 + fVar9 + fVar3;
    fVar10 = fVar27 * 0.0;
    fVar6 = fVar11 * 0.0;
    fVar3 = fVar12 + fVar10 + fVar6 + fVar3;
    fVar8 = fVar8 * 0.0;
    fVar4 = local_44.y * fVar5 * 0.0;
    fVar14 = fVar13 + fVar8 + fVar2 + fVar4;
    fVar33 = fVar33 * 0.0;
    fVar30 = fVar29 + fVar33 + fVar9 + fVar4;
    fVar12 = fVar12 * 0.0;
    fVar4 = fVar27 + fVar12 + fVar6 + fVar4;
    fVar8 = fVar8 + fVar1;
    fVar33 = fVar33 + fVar23;
    fVar12 = fVar12 + fVar10;
    fVar1 = fVar5 * local_44.z * 0.0;
    fVar20 = fVar19 + fVar8 + fVar1;
    fVar17 = fVar16 + fVar33 + fVar1;
    fVar1 = fVar11 + fVar12 + fVar1;
    fVar19 = fVar7 * 0.0;
    fVar25 = fVar24 * 0.0;
    fVar26 = fVar25 + fVar19;
    fVar32 = fVar3 * 0.0;
    fVar11 = local_44.x * fVar5 + 0.0;
    fVar10 = fVar11 * 0.0;
    fVar31 = fVar30 * 0.0;
    fVar29 = fVar14 * 0.0;
    fVar15 = fVar29 + fVar31;
    fVar28 = fVar4 * 0.0;
    fVar23 = local_44.y * fVar5 + 0.0;
    fVar27 = fVar23 * 0.0;
    fVar18 = fVar17 * 0.0;
    fVar21 = fVar20 * 0.0;
    fVar22 = fVar21 + fVar18;
    fVar13 = fVar1 * 0.0;
    fVar5 = fVar5 * local_44.z + 0.0;
    fVar16 = fVar5 * 0.0;
    fVar2 = fVar8 + fVar2 + 0.0;
    fVar33 = fVar33 + fVar9 + 0.0;
    fVar34 = fVar33 * 0.0;
    fVar8 = fVar2 * 0.0;
    fVar9 = fVar8 + fVar34;
    fVar6 = fVar12 + fVar6 + 0.0;
    fVar12 = fVar6 * 0.0;
    (currentNode->mTransformation).a1 = local_50.x * fVar24 + fVar19 + fVar32 + fVar10;
    (currentNode->mTransformation).a2 = local_50.y * fVar7 + fVar25 + fVar32 + fVar10;
    (currentNode->mTransformation).a3 = local_50.z * fVar3 + fVar26 + fVar10;
    (currentNode->mTransformation).a4 = fVar26 + fVar32 + fVar11;
    (currentNode->mTransformation).b1 = local_50.x * fVar14 + fVar31 + fVar28 + fVar27;
    (currentNode->mTransformation).b2 = local_50.y * fVar30 + fVar29 + fVar28 + fVar27;
    (currentNode->mTransformation).b3 = local_50.z * fVar4 + fVar15 + fVar27;
    (currentNode->mTransformation).b4 = fVar15 + fVar28 + fVar23;
    (currentNode->mTransformation).c1 = local_50.x * fVar20 + fVar18 + fVar13 + fVar16;
    (currentNode->mTransformation).c2 = local_50.y * fVar17 + fVar21 + fVar13 + fVar16;
    (currentNode->mTransformation).c3 = local_50.z * fVar1 + fVar22 + fVar16;
    (currentNode->mTransformation).c4 = fVar22 + fVar13 + fVar5;
    (currentNode->mTransformation).d1 = local_50.x * fVar2 + fVar34 + fVar12 + 0.0;
    (currentNode->mTransformation).d2 = local_50.y * fVar33 + fVar8 + fVar12 + 0.0;
    (currentNode->mTransformation).d3 = local_50.z * fVar6 + fVar9 + 0.0;
    (currentNode->mTransformation).d4 = fVar9 + fVar12 + 1.0;
  }
  return;
}

Assistant:

void ScaleProcess::applyScaling( aiNode *currentNode ) {
    if ( nullptr != currentNode ) {
        // Reconstruct matrix by transform rather than by scale 
        // This prevent scale values being changed which can
        // be meaningful in some cases 
        // like when you want the modeller to 
        // see 1:1 compatibility.
        
        aiVector3D pos, scale;
        aiQuaternion rotation;
        currentNode->mTransformation.Decompose( scale, rotation, pos);
        
        aiMatrix4x4 translation;
        aiMatrix4x4::Translation( pos * mScale, translation );
        
        aiMatrix4x4 scaling;

        // note: we do not use mScale here, this is on purpose.
        aiMatrix4x4::Scaling( scale, scaling );

        aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

        currentNode->mTransformation = translation * RotMatrix * scaling;
    }
}